

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unordered_map_constructor_test.h
# Opt level: O3

void __thiscall
phmap::priv::gtest_suite_ConstructorTest_::
AssignmentOnSelf<phmap::parallel_node_hash_map<phmap::priv::hash_internal::EnumClass,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>,_4UL,_phmap::NullMutex>_>
::TestBody(AssignmentOnSelf<phmap::parallel_node_hash_map<phmap::priv::hash_internal::EnumClass,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>,_4UL,_phmap::NullMutex>_>
           *this)

{
  parallel_node_hash_map<phmap::priv::hash_internal::EnumClass,_int,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>,_4UL,_phmap::NullMutex>
  *m_00;
  raw_hash_set<phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
  *this_00;
  char *message;
  long lVar1;
  pair<const_phmap::priv::hash_internal::EnumClass,_int> pVar2;
  Generator<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>,_void> gen;
  TypeParam m;
  Generator<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>,_void> local_549;
  vector<std::pair<phmap::priv::hash_internal::EnumClass,_int>,_std::allocator<std::pair<phmap::priv::hash_internal::EnumClass,_int>_>_>
  local_548;
  allocator_type local_530;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_528;
  __uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_520;
  void *local_518;
  undefined8 uStack_510;
  long local_508;
  undefined4 local_500;
  void *local_4f8;
  undefined8 uStack_4f0;
  long local_4e8;
  pair<const_phmap::priv::hash_internal::EnumClass,_int> local_4e0;
  EnumClass local_4d0;
  int local_4c8;
  EnumClass local_4c0;
  int local_4b8;
  EnumClass local_4b0;
  int local_4a8;
  EnumClass local_4a0;
  int local_498;
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
  local_490;
  
  pVar2 = hash_internal::
          Generator<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>,_void>::operator()
                    (&local_549);
  local_4e0.first = pVar2.first;
  local_4e0.second = pVar2.second;
  pVar2 = hash_internal::
          Generator<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>,_void>::operator()
                    (&local_549);
  local_4d0 = pVar2.first;
  local_4c8 = pVar2.second;
  pVar2 = hash_internal::
          Generator<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>,_void>::operator()
                    (&local_549);
  local_4c0 = pVar2.first;
  local_4b8 = pVar2.second;
  pVar2 = hash_internal::
          Generator<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>,_void>::operator()
                    (&local_549);
  local_4b0 = pVar2.first;
  local_4a8 = pVar2.second;
  pVar2 = hash_internal::
          Generator<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>,_void>::operator()
                    (&local_549);
  local_4a0 = pVar2.first;
  local_498 = pVar2.second;
  local_520._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        )(tuple<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          )hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
           next_id<phmap::priv::StatefulTestingHash>()::gId._M_head_impl;
  local_548.
  super__Vector_base<std::pair<phmap::priv::hash_internal::EnumClass,_int>,_std::allocator<std::pair<phmap::priv::hash_internal::EnumClass,_int>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
       next_id<phmap::priv::StatefulTestingEqual>()::gId;
  local_530.id_ = 0;
  lVar1 = 0;
  hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
  next_id<phmap::priv::StatefulTestingHash>()::gId._M_head_impl =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
       ((long)hash_testing_internal::WithId<phmap::priv::StatefulTestingHash>::
              next_id<phmap::priv::StatefulTestingHash>()::gId._M_head_impl + 1);
  hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
  next_id<phmap::priv::StatefulTestingEqual>()::gId =
       (pointer)((long)&hash_testing_internal::WithId<phmap::priv::StatefulTestingEqual>::
                        next_id<phmap::priv::StatefulTestingEqual>()::gId->first + 1);
  parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::EnumClass,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::hash_internal::EnumClass_const,int>>>
  ::parallel_hash_set<std::pair<phmap::priv::hash_internal::EnumClass_const,int>const*>
            ((parallel_hash_set<4ul,phmap::priv::raw_hash_set,phmap::NullMutex,phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::EnumClass,int>,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::hash_internal::EnumClass_const,int>>>
              *)&local_490,&local_4e0,
             (pair<const_phmap::priv::hash_internal::EnumClass,_int> *)&local_490,0,
             (hasher *)&local_520,(key_equal *)&local_548,&local_530);
  do {
    this_00 = (raw_hash_set<phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
               *)((long)&local_490.sets_._M_elems[0].set_.ctrl_ + lVar1);
    raw_hash_set<phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
    ::operator=(this_00,this_00);
    lVar1 = lVar1 + 0x48;
  } while (lVar1 != 0x480);
  local_500 = 3;
  std::
  vector<std::pair<phmap::priv::hash_internal::EnumClass_const,int>,std::allocator<std::pair<phmap::priv::hash_internal::EnumClass_const,int>>>
  ::vector<std::pair<phmap::priv::hash_internal::EnumClass_const,int>const*,void>
            ((vector<std::pair<phmap::priv::hash_internal::EnumClass_const,int>,std::allocator<std::pair<phmap::priv::hash_internal::EnumClass_const,int>>>
              *)&local_4f8,&local_4e0,
             (pair<const_phmap::priv::hash_internal::EnumClass,_int> *)&local_490,
             (allocator_type *)&local_548);
  local_508 = local_4e8;
  uStack_510 = uStack_4f0;
  local_518 = local_4f8;
  local_4f8 = (void *)0x0;
  uStack_4f0 = 0;
  local_4e8 = 0;
  local_520._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_4_ = local_500;
  items<phmap::parallel_node_hash_map<phmap::priv::hash_internal::EnumClass,int,phmap::priv::StatefulTestingHash,phmap::priv::StatefulTestingEqual,phmap::priv::Alloc<std::pair<phmap::priv::hash_internal::EnumClass_const,int>>,4ul,phmap::NullMutex>>
            (&local_548,(priv *)&local_490,m_00);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::UnorderedElementsAreArrayMatcher<std::pair<phmap::priv::hash_internal::EnumClass_const,int>>>
  ::operator()(&local_530,(char *)&local_520,
               (vector<std::pair<phmap::priv::hash_internal::EnumClass,_int>,_std::allocator<std::pair<phmap::priv::hash_internal::EnumClass,_int>_>_>
                *)"items(m)");
  if (local_548.
      super__Vector_base<std::pair<phmap::priv::hash_internal::EnumClass,_int>,_std::allocator<std::pair<phmap::priv::hash_internal::EnumClass,_int>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_548.
                    super__Vector_base<std::pair<phmap::priv::hash_internal::EnumClass,_int>,_std::allocator<std::pair<phmap::priv::hash_internal::EnumClass,_int>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_548.
                          super__Vector_base<std::pair<phmap::priv::hash_internal::EnumClass,_int>,_std::allocator<std::pair<phmap::priv::hash_internal::EnumClass,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_548.
                          super__Vector_base<std::pair<phmap::priv::hash_internal::EnumClass,_int>,_std::allocator<std::pair<phmap::priv::hash_internal::EnumClass,_int>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  if (local_518 != (void *)0x0) {
    operator_delete(local_518,local_508 - (long)local_518);
  }
  if (local_4f8 != (void *)0x0) {
    operator_delete(local_4f8,local_4e8 - (long)local_4f8);
  }
  if ((char)local_530.id_ == '\0') {
    testing::Message::Message((Message *)&local_520);
    if (local_528 == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_528->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_548,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/unordered_map_constructor_test.h"
               ,0x1db,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_548,(Message *)&local_520);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_548);
    if (local_520._M_t.
        super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        .
        super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
        ._M_head_impl !=
        (_Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         )0x0) {
      (**(code **)(*(long *)local_520._M_t.
                            super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            .
                            super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                            ._M_head_impl + 8))();
    }
  }
  if (local_528 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_528,local_528);
  }
  parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<phmap::priv::hash_internal::EnumClass,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::hash_internal::EnumClass,_int>_>_>
  ::~parallel_hash_set(&local_490);
  return;
}

Assistant:

TYPED_TEST_P(ConstructorTest, AssignmentOnSelf) {
  using T = hash_internal::GeneratedType<TypeParam>;
  hash_internal::Generator<T> gen;
  std::initializer_list<T> values = {gen(), gen(), gen(), gen(), gen()};
  TypeParam m(values);
  m = *&m;  // Avoid -Wself-assign
  EXPECT_THAT(items(m), ::testing::UnorderedElementsAreArray(values));
}